

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

shared_ptr<pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>_> __thiscall
pbrt::syntactic::Param::as<pbrt::syntactic::Texture>(Param *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>_> sVar1;
  enable_shared_from_this<pbrt::syntactic::Param> *in_stack_ffffffffffffffc8;
  shared_ptr<pbrt::syntactic::Param> *in_stack_ffffffffffffffe8;
  
  std::enable_shared_from_this<pbrt::syntactic::Param>::shared_from_this(in_stack_ffffffffffffffc8);
  std::
  dynamic_pointer_cast<pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>,pbrt::syntactic::Param>
            (in_stack_ffffffffffffffe8);
  std::shared_ptr<pbrt::syntactic::Param>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Param> *)0x1f6c07);
  sVar1.
  super___shared_ptr<pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.
  super___shared_ptr<pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (shared_ptr<pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>_>)
         sVar1.
         super___shared_ptr<pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<ParamArray<T>> Param::as()
    { return std::dynamic_pointer_cast<ParamArray<T>>(shared_from_this()); }